

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pDistinct,u16 wctrlFlags,int iIdxCur)

{
  WhereLevel *pWVar1;
  WhereLevel *pLevel;
  WhereMaskSet *pMaskSet;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 uVar6;
  Vdbe *pVVar7;
  sqlite3 *psVar8;
  Table *pTVar9;
  Vdbe *pVVar10;
  Op *pOVar11;
  Parse *pParse_00;
  SrcList *pSVar12;
  sqlite3_index_info *psVar13;
  sqlite3_index_constraint_usage *psVar14;
  sqlite3_index_constraint *psVar15;
  tRowcnt *ptVar16;
  SrcList *pSVar17;
  uint p2;
  char cVar18;
  u8 uVar19;
  u16 uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  WhereInfo *pWInfo;
  long lVar26;
  Expr *pEVar27;
  Bitmask BVar28;
  VTable *zP4;
  KeyInfo *pKVar29;
  Index *pIVar30;
  CollSeq *pCVar31;
  Bitmask BVar32;
  int *piVar33;
  byte *pbVar34;
  WhereTerm *pWVar35;
  WhereTerm *pWVar36;
  char *zAff;
  SrcList *pTabList_00;
  SrcList *pSVar37;
  Expr *pEVar38;
  WhereInfo *pWInfo_00;
  uint uVar39;
  ExprList *pList;
  char *pcVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  Index **ppIVar45;
  Index *pIVar46;
  char cVar47;
  int iVar48;
  int *piVar49;
  WhereTerm *pWVar50;
  WhereClause *pWC;
  SrcList_item *pSVar51;
  Expr *pEVar52;
  SrcList_item *pSVar53;
  SrcList *pSVar54;
  byte *pbVar55;
  int iVar56;
  ulong uVar57;
  WhereClause *pWVar58;
  int iVar59;
  uint n;
  ulong uVar60;
  sqlite3_index_info **ppsVar61;
  int iVar62;
  int iTarget;
  u8 *puVar63;
  ulong uVar64;
  ulong uVar65;
  bool bVar66;
  bool bVar67;
  byte bVar68;
  double local_1e8;
  ulong local_1e0;
  anon_union_8_3_b4c78fbb_for_u local_1d0;
  WhereLevel *local_1c0;
  WhereLevel *local_1b0;
  Index *local_1a8;
  ulong local_180;
  ulong local_170;
  ulong local_158;
  WhereTerm *local_148;
  undefined1 local_118 [16];
  WhereTerm *local_108;
  WhereBestIdx local_f0;
  int rTemp;
  anon_union_8_2_443a03b8_for_u local_70;
  Parse *pPStack_68;
  Expr *local_60;
  anon_union_8_4_3af73d92_for_u aStack_58;
  
  bVar68 = 0;
  pVVar7 = pParse->pVdbe;
  local_f0.cost.plan.u.pIdx = (Index *)0x0;
  local_f0.cost.rCost = 0.0;
  local_f0.cost.plan.wsFlags = 0;
  local_f0.cost.plan.nEq = 0;
  local_f0.cost.plan.nOBSat = 0;
  local_f0.cost.plan.nRow = 0.0;
  local_f0.i = 0;
  local_f0.n = 0;
  local_f0.aLevel = (WhereLevel *)0x0;
  local_f0.pDistinct = (ExprList *)0x0;
  local_f0.ppIdxInfo = (sqlite3_index_info **)0x0;
  local_f0.notValid = 0;
  local_f0.pOrderBy = (ExprList *)0x0;
  local_f0.cost.used = 0;
  local_f0.pSrc = (SrcList_item *)0x0;
  local_f0.notReady = 0;
  local_f0.pParse = pParse;
  if (0x40 < pTabList->nSrc) {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
    return (WhereInfo *)0x0;
  }
  uVar57 = (ulong)(uint)(int)pTabList->nSrc;
  if ((wctrlFlags & 0x40) != 0) {
    uVar57 = 1;
  }
  psVar8 = pParse->db;
  iVar23 = (int)uVar57;
  uVar60 = (long)(iVar23 * 0x60 + 0x47) & 0xffffffffffffffe0;
  pWInfo = (WhereInfo *)sqlite3DbMallocZero(psVar8,(int)uVar60 + 0x2f4);
  if (psVar8->mallocFailed != '\0') {
    sqlite3DbFree(psVar8,pWInfo);
    return (WhereInfo *)0x0;
  }
  pWInfo->nLevel = iVar23;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  iVar21 = sqlite3VdbeMakeLabel(pVVar7);
  pWInfo->iBreak = iVar21;
  pWVar58 = (WhereClause *)((long)pWInfo->a + (uVar60 - 0x40));
  pWInfo->pWC = pWVar58;
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pMaskSet = (WhereMaskSet *)((long)pWInfo[3].a + (uVar60 - 0x30));
  pWVar1 = pWInfo->a;
  pList = (ExprList *)0x0;
  if ((psVar8->dbOptFlags & 0x20) == 0) {
    pList = pDistinct;
  }
  local_f0.pWC = pWVar58;
  local_f0.aLevel = pWVar1;
  memset(pMaskSet,0,0x104);
  *(Parse **)((long)pWInfo->a + (uVar60 - 0x40)) = pParse;
  *(WhereMaskSet **)((long)pWInfo->a + (uVar60 - 0x38)) = pMaskSet;
  *(undefined8 *)((long)pWInfo->a + (uVar60 - 0x30)) = 0;
  *(undefined8 *)((long)pWInfo->a + (uVar60 - 0x24)) = 0x800000000;
  *(ulong *)((long)pWInfo->a + (uVar60 - 0x18)) = (long)pWInfo->a + (uVar60 - 0x10);
  *(u16 *)((long)pWInfo->a + (uVar60 - 0x26)) = wctrlFlags;
  if ((pParse->cookieGoto == 0) && ((pParse->db->dbOptFlags & 8) == 0)) {
    local_70.zToken = (char *)0x0;
    local_60 = (Expr *)0x0;
    aStack_58.pNC = (NameContext *)0x0;
    _rTemp = evalConstExpr;
    pPStack_68 = pParse;
    sqlite3WalkExpr((Walker *)&rTemp,pWhere);
  }
  pWC = (WhereClause *)pWhere;
  whereSplit(pWVar58,pWhere,0x45);
  if ((pWhere != (Expr *)0x0) &&
     ((iVar23 == 0 || (iVar21 = sqlite3ExprIsConstantNotJoin(pWhere), iVar21 != 0)))) {
    sqlite3ExprIfFalse(pParse,pWhere,pWInfo->iBreak,8);
    pWC = (WhereClause *)pWhere;
  }
  uVar5 = pTabList->nSrc;
  lVar26 = 0;
  if ((short)uVar5 < 1) {
    uVar5 = 0;
  }
  for (; (ulong)uVar5 * 0x68 - lVar26 != 0; lVar26 = lVar26 + 0x68) {
    uVar6 = *(undefined4 *)((long)&pTabList->a[0].iCursor + lVar26);
    pWC = (WhereClause *)(long)*(int *)&pWVar58[1].pParse;
    *(int *)&pWVar58[1].pParse = *(int *)&pWVar58[1].pParse + 1;
    *(undefined4 *)((long)pWVar58[1].aStatic + (long)pWC * 4 + -0x2c) = uVar6;
  }
  exprAnalyzeAll((SrcList *)pWVar58,pWC);
  if (psVar8->mallocFailed != '\0') goto LAB_00173613;
  iVar21 = 0;
  if (pList == (ExprList *)0x0) goto LAB_00173129;
  if (pTabList->nSrc == 1) {
    iVar48 = pTabList->a[0].iCursor;
    pTVar9 = pTabList->a[0].pTab;
    uVar64 = 0;
    uVar60 = (ulong)(uint)pList->nExpr;
    if (pList->nExpr < 1) {
      uVar60 = uVar64;
    }
    for (; uVar60 * 0x20 != uVar64; uVar64 = uVar64 + 0x20) {
      pEVar27 = sqlite3ExprSkipCollate(*(Expr **)((long)&pList->a->pExpr + uVar64));
      if (((pEVar27->op == 0x98) && (pEVar27->iTable == iVar48)) && (pEVar27->iColumn < 0))
      goto LAB_0017311d;
    }
    ppIVar45 = &pTVar9->pIndex;
    while (pIVar30 = *ppIVar45, pDistinct = pList, pIVar30 != (Index *)0x0) {
      if (pIVar30->onError != '\0') {
        uVar60 = 0;
        while ((uVar60 < pIVar30->nColumn &&
               ((pWVar36 = findTerm(pWVar58,iVar48,pIVar30->aiColumn[uVar60],0xffffffffffffffff,2,
                                    pIVar30), pWVar36 != (WhereTerm *)0x0 ||
                ((iVar59 = findIndexCol(pParse,pList,iVar48,pIVar30,(int)uVar60), -1 < iVar59 &&
                 (pTVar9->aCol[pIVar30->aiColumn[uVar60]].notNull != '\0'))))))) {
          uVar60 = uVar60 + 1;
        }
        if (pIVar30->nColumn == uVar60) goto LAB_0017311d;
      }
      ppIVar45 = &pIVar30->pNext;
    }
  }
LAB_00173134:
  local_f0.notValid = 0xffffffffffffffff;
  local_f0._64_8_ = uVar57 << 0x20;
  uVar22 = 0xffffffff;
  iVar48 = 0;
  local_1b0 = pWVar1;
  local_f0.pOrderBy = pOrderBy;
  local_f0.pDistinct = pDistinct;
  while (BVar32 = local_f0.notValid, iVar21 < iVar23) {
    local_170 = 0;
    iVar21 = 0;
    iVar59 = iVar23 + -1;
    if (iVar48 != iVar23 + -1) {
      puVar63 = &pTabList->a[iVar48].jointype;
      iVar21 = -1;
      iVar59 = iVar48;
      for (; iVar48 < iVar23; iVar48 = iVar48 + 1) {
        BVar28 = getMask(pMaskSet,*(int *)(puVar63 + 4));
        if ((BVar32 & BVar28) == 0) {
          iVar59 = iVar59 + (uint)(iVar48 == iVar59);
        }
        else {
          if ((iVar59 < iVar48) && ((*puVar63 & 10) != 0)) break;
          if (iVar21 != -1) {
            iVar21 = 1;
            break;
          }
          iVar21 = 0;
          if ((*puVar63 & 8) != 0) break;
        }
        puVar63 = puVar63 + 0x68;
      }
      local_f0.pSrc = (SrcList_item *)(puVar63 + -0x38);
    }
    lVar26 = (long)iVar59;
    local_118 = ZEXT816(0);
    local_1e8 = 0.0;
    local_1d0.pIdx = (Index *)0x0;
    local_1c0 = (WhereLevel *)0x547d42aea2879f2e;
    iVar48 = -1;
    iVar56 = 0;
    iVar62 = iVar21;
    while ((-1 < iVar62 &&
           (lVar41 = lVar26, ppsVar61 = &pWInfo->a[lVar26].pIdxInfo, pSVar51 = pTabList->a + lVar26,
           iVar48 < 0))) {
      for (; (local_f0.pSrc = pSVar51, lVar41 < iVar23 &&
             ((lVar41 <= lVar26 || ((pSVar51->jointype & 10) == 0)))); pSVar51 = pSVar51 + 1) {
        BVar28 = getMask(pMaskSet,pSVar51->iCursor);
        if ((BVar32 & BVar28) != 0) {
          local_f0.notReady = BVar28;
          if (iVar62 == 0) {
            local_f0.notReady = BVar32;
          }
          iVar56 = iVar56 + (uint)(pSVar51->pIndex == (Index *)0x0);
          if ((pSVar51->pTab->tabFlags & 0x10) == 0) {
            bestBtreeIndex(&local_f0);
          }
          else {
            local_f0.ppIdxInfo = ppsVar61;
            bestVirtualIndex(&local_f0);
          }
          if (iVar62 == 0) {
            if (iVar21 != 0) {
              local_f0.cost.rCost = local_f0.cost.rCost / (double)ppsVar61[-1];
            }
          }
          else {
            ppsVar61[-1] = (sqlite3_index_info *)local_f0.cost.rCost;
          }
          if (((local_f0.cost.used & local_f0.notValid) == 0) &&
             (((iVar56 == 0 || ((local_f0.pSrc)->pIndex == (Index *)0x0)) ||
              ((local_f0.cost.plan._0_8_ & 0x100f3000) != 0)))) {
            if ((iVar48 < 0) || (local_f0.cost.rCost < (double)local_1c0)) {
LAB_0017341a:
              local_170 = local_f0.cost.plan._0_8_ & 0xffffffff;
              local_118 = ZEXT416((uint)local_f0.cost.plan._4_4_);
              local_1e8 = local_f0.cost.plan.nRow;
              local_1d0 = local_f0.cost.plan.u;
              local_1c0 = (WhereLevel *)local_f0.cost.rCost;
              iVar48 = (int)lVar41;
            }
            else if (local_f0.cost.rCost <= (double)local_1c0) {
              if (((ushort)local_118._2_2_ < local_f0.cost.plan.nOBSat) ||
                 (local_f0.cost.plan.nRow < local_1e8)) goto LAB_0017341a;
            }
          }
          BVar32 = local_f0.notValid;
          pSVar51 = local_f0.pSrc;
          if (((local_f0.pSrc)->jointype & 8) != 0) break;
        }
        lVar41 = lVar41 + 1;
        ppsVar61 = ppsVar61 + 0xc;
      }
      iVar62 = iVar62 + -1;
    }
    if (((uint)local_170 >> 0x1e & 1) != 0) {
      pWInfo->eDistinct = '\x02';
    }
    (local_1b0->plan).wsFlags = (uint)local_170;
    (local_1b0->plan).nEq = (short)local_118._0_4_;
    (local_1b0->plan).nOBSat = (short)((uint)local_118._0_4_ >> 0x10);
    (local_1b0->plan).nRow = local_1e8;
    (local_1b0->plan).u.pIdx = (Index *)local_1d0;
    iVar21 = pTabList->a[iVar48].iCursor;
    local_1b0->iTabCur = iVar21;
    iVar62 = -1;
    if (((local_170 & 0x200f0000) != 0) &&
       (((wctrlFlags & 0x40) == 0 || (iVar62 = iIdxCur, (local_170 & 0x20000000) != 0)))) {
      iVar62 = pParse->nTab;
      pParse->nTab = iVar62 + 1;
    }
    local_1b0->iIdxCur = iVar62;
    BVar28 = getMask(pMaskSet,iVar21);
    local_f0.notValid = BVar32 & ~BVar28;
    local_1b0->iFrom = (u8)iVar48;
    if (1.0 <= local_1e8) {
      pParse->nQueryLoop = local_1e8 * pParse->nQueryLoop;
    }
    pIVar30 = pTabList->a[iVar48].pIndex;
    if ((pIVar30 != (Index *)0x0) && ((local_170 & 0xf0000) == 0)) {
      sqlite3ErrorMsg(pParse,"cannot use index: %s",pIVar30->zName);
      goto LAB_00173609;
    }
    uVar22 = (uint)local_170 & uVar22;
    iVar21 = local_f0.i + 1;
    local_f0.i = iVar21;
    local_1b0 = local_1b0 + 1;
    iVar48 = iVar59;
  }
  if ((pParse->nErr == 0) && (psVar8->mallocFailed == '\0')) {
    if (iVar23 == 0) {
      uVar20 = 0;
    }
    else {
      uVar20 = *(u16 *)((long)(local_1b0 + -1) + 6);
    }
    pWInfo->nOBSat = uVar20;
    if ((pOrderBy != (ExprList *)0x0) && ((uVar22 & 0x2000000) != 0)) {
      pWInfo->nOBSat = (u16)pOrderBy->nExpr;
    }
    if (((wctrlFlags & 4) != 0) && ((uVar22 & 0x2000000) != 0)) {
      pWInfo->okOnePass = '\x01';
      pbVar34 = (byte *)((long)&pWInfo->a[0].plan.wsFlags + 2);
      *pbVar34 = *pbVar34 & 0xbf;
    }
    sqlite3CodeVerifySchema(pParse,-1);
    pWVar58 = local_f0.pWC;
    pWInfo->nRowOut = 1.0;
    iVar21 = 0;
    if (iVar23 < 1) {
      uVar57 = 0;
    }
    local_158 = 0xffffffffffffffff;
    local_1c0 = pWVar1;
    for (; iVar21 != (int)uVar57; iVar21 = iVar21 + 1) {
      pSVar51 = pTabList->a + local_1c0->iFrom;
      pTVar9 = pTabList->a[local_1c0->iFrom].pTab;
      pWInfo->nRowOut = (local_1c0->plan).nRow * pWInfo->nRowOut;
      iVar23 = sqlite3SchemaToIndex(psVar8,pTVar9->pSchema);
      if (((pTVar9->tabFlags & 2) == 0) && (pTVar9->pSelect == (Select *)0x0)) {
        uVar22 = (local_1c0->plan).wsFlags;
        if ((uVar22 >> 0x1b & 1) == 0) {
          if ((pTVar9->tabFlags & 0x10) == 0) {
            if ((uVar22 & 0x400000) == 0 && (wctrlFlags & 0x10) == 0) {
              sqlite3OpenTable(pParse,pSVar51->iCursor,iVar23,pTVar9,
                               0x28 - (uint)(pWInfo->okOnePass == '\0'));
              if ((pWInfo->okOnePass == '\0') && (pTVar9->nCol < 0x40)) {
                pcVar40 = (char *)0x0;
                for (BVar32 = pSVar51->colUsed; BVar32 != 0; BVar32 = BVar32 >> 1) {
                  pcVar40 = pcVar40 + 1;
                }
                sqlite3VdbeChangeP4(pVVar7,pVVar7->nOp + -1,pcVar40,-0xe);
              }
            }
            else {
              sqlite3TableLock(pParse,iVar23,pTVar9->tnum,'\0',pTVar9->zName);
            }
          }
        }
        else {
          zP4 = sqlite3GetVTable(psVar8,pTVar9);
          sqlite3VdbeAddOp4(pVVar7,0x87,pSVar51->iCursor,0,0,(char *)zP4,-10);
        }
      }
      uVar22 = (local_1c0->plan).wsFlags;
      if ((uVar22 >> 0x1d & 1) == 0) {
        if ((uVar22 & 0xf0000) != 0) {
          pIVar30 = (local_1c0->plan).u.pIdx;
          pKVar29 = sqlite3IndexKeyinfo(pParse,pIVar30);
          sqlite3VdbeAddOp4(pVVar7,0x27,local_1c0->iIdxCur,pIVar30->tnum,iVar23,(char *)pKVar29,
                            -0x10);
        }
      }
      else {
        pVVar10 = pParse->pVdbe;
        uVar22 = sqlite3CodeOnce(pParse);
        pTVar9 = pSVar51->pTab;
        pWVar36 = pWVar58->a;
        pWVar50 = pWVar36 + pWVar58->nTerm;
        uVar60 = 0;
        iVar48 = 0;
        for (; pWVar36 < pWVar50; pWVar36 = pWVar36 + 1) {
          iVar59 = termCanDriveIndex(pWVar36,pSVar51,local_158);
          if (iVar59 != 0) {
            uVar64 = 1L << ((byte)(pWVar36->u).leftColumn & 0x3f);
            if (0x3f < (pWVar36->u).leftColumn) {
              uVar64 = 0x8000000000000000;
            }
            bVar66 = (uVar64 & uVar60) == 0;
            if (!bVar66) {
              uVar64 = 0;
            }
            uVar60 = uVar60 | uVar64;
            iVar48 = iVar48 + (uint)bVar66;
          }
        }
        (local_1c0->plan).nEq = (u16)iVar48;
        uVar64 = pSVar51->colUsed;
        uVar65 = (~uVar60 | 0x8000000000000000) & uVar64;
        uVar39 = (uint)pTVar9->nCol;
        uVar60 = 0;
        if (0 < pTVar9->nCol) {
          uVar60 = (ulong)uVar39;
        }
        if (0x3e < (int)uVar39) {
          uVar60 = 0x3f;
        }
        for (uVar44 = 0; uVar60 != uVar44; uVar44 = uVar44 + 1) {
          iVar48 = iVar48 + (uint)((uVar65 >> (uVar44 & 0x3f) & 1) != 0);
        }
        (local_1c0->plan).wsFlags = (local_1c0->plan).wsFlags | 0x410002;
        iVar48 = iVar48 + ((uint)((long)uVar64 >> 0x3f) & uVar39 - 0x3f);
        pIVar30 = (Index *)sqlite3DbMallocZero(pParse->db,iVar48 * 0xd + 0x50);
        if (pIVar30 != (Index *)0x0) {
          (local_1c0->plan).u.pIdx = pIVar30;
          pIVar30->azColl = &pIVar30[1].zName;
          pIVar30->aiColumn = (int *)(&pIVar30[1].zName + iVar48);
          pIVar30->aSortOrder = (u8 *)((long)(&pIVar30[1].zName + iVar48) + (long)iVar48 * 4);
          pIVar30->zName = "auto-index";
          pIVar30->nColumn = (u16)iVar48;
          pIVar30->pTable = pTVar9;
          pWVar36 = pWVar58->a;
          local_1e0 = 0;
          iVar59 = 0;
          for (; pWVar36 < pWVar50; pWVar36 = pWVar36 + 1) {
            iVar62 = termCanDriveIndex(pWVar36,pSVar51,local_158);
            if (iVar62 != 0) {
              iVar62 = (pWVar36->u).leftColumn;
              uVar64 = 1L << ((byte)iVar62 & 0x3f);
              if (0x3f < iVar62) {
                uVar64 = 0x8000000000000000;
              }
              if ((local_1e0 & uVar64) == 0) {
                pEVar27 = pWVar36->pExpr;
                pIVar30->aiColumn[iVar59] = iVar62;
                pCVar31 = sqlite3BinaryCompareCollSeq(pParse,pEVar27->pLeft,pEVar27->pRight);
                pcVar40 = "BINARY";
                if (pCVar31 != (CollSeq *)0x0) {
                  pcVar40 = pCVar31->zName;
                }
                local_1e0 = local_1e0 | uVar64;
                pIVar30->azColl[iVar59] = pcVar40;
                iVar59 = iVar59 + 1;
              }
            }
          }
          for (uVar64 = 0; lVar26 = (long)iVar59, uVar60 != uVar64; uVar64 = uVar64 + 1) {
            if ((uVar65 >> (uVar64 & 0x3f) & 1) != 0) {
              pIVar30->aiColumn[lVar26] = (int)uVar64;
              pIVar30->azColl[lVar26] = "BINARY";
              iVar59 = iVar59 + 1;
            }
          }
          if ((long)pSVar51->colUsed < 0) {
            sVar3 = pTVar9->nCol;
            for (iVar59 = 0x3f; iVar59 < sVar3; iVar59 = iVar59 + 1) {
              pIVar30->aiColumn[lVar26] = iVar59;
              pIVar30->azColl[lVar26] = "BINARY";
              lVar26 = lVar26 + 1;
            }
          }
          pKVar29 = sqlite3IndexKeyinfo(pParse,pIVar30);
          sqlite3VdbeAddOp4(pVVar10,0x29,local_1c0->iIdxCur,iVar48 + 1,0,(char *)pKVar29,-0x10);
          uVar39 = sqlite3VdbeAddOp1(pVVar10,0x48,local_1c0->iTabCur);
          iVar48 = sqlite3GetTempReg(pParse);
          sqlite3GenerateIndexKey(pParse,pIVar30,local_1c0->iTabCur,iVar48,1);
          sqlite3VdbeAddOp2(pVVar10,0x61,local_1c0->iIdxCur,iVar48);
          if (pVVar10->aOp != (Op *)0x0) {
            pVVar10->aOp[(long)pVVar10->nOp + -1].p5 = '\x10';
          }
          sqlite3VdbeAddOp2(pVVar10,0x5f,local_1c0->iTabCur,uVar39 + 1);
          pOVar11 = pVVar10->aOp;
          if (pOVar11 != (Op *)0x0) {
            pOVar11[(long)pVVar10->nOp + -1].p5 = '\x03';
          }
          if ((-1 < (int)uVar39) && (uVar39 < (uint)pVVar10->nOp)) {
            pOVar11[uVar39].p2 = pVVar10->nOp;
          }
          sqlite3ReleaseTempReg(pParse,iVar48);
          if ((-1 < (int)uVar22) && (uVar22 < (uint)pVVar10->nOp)) {
            pVVar10->aOp[uVar22].p2 = pVVar10->nOp;
          }
        }
      }
      sqlite3CodeVerifySchema(pParse,iVar23);
      BVar32 = getMask(pWVar58->pMaskSet,pSVar51->iCursor);
      local_158 = local_158 & ~BVar32;
      local_1c0 = local_1c0 + 1;
    }
    pWInfo->iTop = pVVar7->nOp;
    if (psVar8->mallocFailed == '\0') {
      pbVar34 = (byte *)((long)&pWInfo[1].savedNQueryLoop + 4);
      local_1c0 = (WhereLevel *)0xffffffffffffffff;
      uVar60 = 0;
      do {
        if (uVar60 == uVar57) {
          return pWInfo;
        }
        pLevel = pWVar1 + uVar60;
        iVar59 = (int)uVar60;
        explainOneScan(pParse,pTabList,pLevel,iVar59,(uint)pWInfo->a[uVar60].iFrom,wctrlFlags);
        pParse_00 = pWInfo->pParse;
        pSVar12 = pWInfo->pTabList;
        pVVar7 = pParse_00->pVdbe;
        pWVar58 = pWInfo->pWC;
        bVar2 = pWInfo->a[uVar60].iFrom;
        iVar23 = pSVar12->a[bVar2].iCursor;
        uVar22 = pWVar1[uVar60].plan.wsFlags;
        iVar21 = sqlite3VdbeMakeLabel(pVVar7);
        pWInfo->a[uVar60].addrNxt = iVar21;
        pWInfo->a[uVar60].addrBrk = iVar21;
        iVar48 = sqlite3VdbeMakeLabel(pVVar7);
        pWInfo->a[uVar60].addrCont = iVar48;
        if ((pWInfo->a[uVar60].iFrom != '\0') && ((pSVar12->a[bVar2].jointype & 8) != 0)) {
          iVar62 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar62;
          pLevel->iLeftJoin = iVar62;
          sqlite3VdbeAddOp2(pVVar7,7,0,iVar62);
        }
        if ((pSVar12->a[bVar2].field_0x39 & 4) == 0) {
          uVar39 = (pLevel->plan).wsFlags;
          if ((uVar39 >> 0x1b & 1) != 0) {
            psVar13 = (pLevel->plan).u.pVtabIdx;
            uVar22 = psVar13->nConstraint;
            psVar14 = psVar13->aConstraintUsage;
            psVar15 = psVar13->aConstraint;
            pParse_00->iCacheLevel = pParse_00->iCacheLevel + 1;
            iVar21 = sqlite3GetTempRange(pParse_00,uVar22 + 2);
            uVar64 = 0;
            if (0 < (int)uVar22) {
              uVar64 = (ulong)uVar22;
            }
            iVar59 = pLevel->addrBrk;
            iVar62 = (int)uVar64 + 1;
            piVar49 = &psVar15->iTermOffset;
            for (iVar56 = 1; iVar25 = iVar62, iVar56 != iVar62; iVar56 = iVar56 + 1) {
              uVar65 = 0;
              piVar33 = piVar49;
              while( true ) {
                iVar25 = iVar56;
                if (uVar22 == uVar65) goto LAB_00173ff6;
                if (psVar14[uVar65].argvIndex == iVar56) break;
                uVar65 = uVar65 + 1;
                piVar33 = piVar33 + 3;
              }
              iVar24 = iVar21 + 1 + iVar56;
              pWVar36 = pWVar58->a + *piVar33;
              if ((pWVar58->a[*piVar33].eOperator & 1) == 0) {
                sqlite3ExprCode(pParse_00,pWVar36->pExpr->pRight,iVar24);
              }
              else {
                codeEqualityTerm(pParse_00,pWVar36,pLevel,(uint)uVar65,iVar24);
                iVar59 = pLevel->addrNxt;
              }
              if (uVar22 == (uint)uVar65) break;
            }
LAB_00173ff6:
            sqlite3VdbeAddOp2(pVVar7,7,psVar13->idxNum,iVar21);
            sqlite3VdbeAddOp2(pVVar7,7,iVar25 + -1,iVar21 + 1);
            sqlite3VdbeAddOp4(pVVar7,0x88,iVar23,iVar59,iVar21,psVar13->idxStr,
                              (uint)(psVar13->needToFreeIdxStr == 0) * 9 + -0xb);
            psVar13->needToFreeIdxStr = 0;
            for (uVar65 = 0; uVar64 != uVar65; uVar65 = uVar65 + 1) {
              if (psVar14[uVar65].omit != '\0') {
                disableTerm(pLevel,pWVar58->a + *piVar49);
              }
              piVar49 = piVar49 + 3;
            }
            pLevel->op = 0x8a;
            pLevel->p1 = iVar23;
            pLevel->p2 = pVVar7->nOp;
            sqlite3ReleaseTempRange(pParse_00,iVar21,uVar22 + 2);
            sqlite3ExprCachePop(pParse_00,iVar21);
LAB_001740d8:
            iVar59 = 0;
            goto LAB_00174186;
          }
          if ((uVar39 >> 0xc & 1) != 0) {
            iVar59 = sqlite3GetTempReg(pParse_00);
            pWVar36 = findTerm(pWVar58,iVar23,-1,(Bitmask)local_1c0,3,(Index *)0x0);
            iVar62 = codeEqualityTerm(pParse_00,pWVar36,pLevel,0,iVar59);
            iVar21 = pLevel->addrNxt;
            sqlite3VdbeAddOp2(pVVar7,0x15,iVar62,iVar21);
            sqlite3VdbeAddOp3(pVVar7,0x36,iVar23,iVar21,iVar62);
            sqlite3ExprCacheRemove(pParse_00,iVar62,1);
            sqlite3ExprCacheStore(pParse_00,iVar23,-1,iVar62);
            pLevel->op = 0x95;
            goto LAB_00174186;
          }
          if ((uVar39 >> 0xd & 1) != 0) {
            uVar22 = uVar22 & 0x1000000;
            pWVar35 = findTerm(pWVar58,iVar23,-1,(Bitmask)local_1c0,0x24,(Index *)0x0);
            pWVar36 = findTerm(pWVar58,iVar23,-1,(Bitmask)local_1c0,0x18,(Index *)0x0);
            pWVar50 = pWVar35;
            if (uVar22 != 0) {
              pWVar50 = pWVar36;
              pWVar36 = pWVar35;
            }
            if (pWVar50 == (WhereTerm *)0x0) {
              sqlite3VdbeAddOp2(pVVar7,(uint)(uVar22 == 0) * 5 + 0x43,iVar23,iVar21);
            }
            else {
              pEVar27 = pWVar50->pExpr;
              iVar59 = sqlite3ExprCodeTemp(pParse_00,pEVar27->pRight,&rTemp);
              sqlite3VdbeAddOp3(pVVar7,(uint)*(byte *)((long)&DAT_0018a7e0 + (ulong)pEVar27->op + 3)
                                ,iVar23,iVar21,iVar59);
              sqlite3ExprCacheRemove(pParse_00,iVar59,1);
              sqlite3ReleaseTempReg(pParse_00,rTemp);
              disableTerm(pLevel,pWVar50);
            }
            if (pWVar36 == (WhereTerm *)0x0) {
              iVar62 = 0x95;
              iVar56 = 0;
            }
            else {
              pEVar27 = pWVar36->pExpr;
              iVar56 = pParse_00->nMem + 1;
              pParse_00->nMem = iVar56;
              sqlite3ExprCode(pParse_00,pEVar27->pRight,iVar56);
              if ((pEVar27->op | 2) == 0x4f) {
                iVar62 = (uint)(uVar22 == 0) * 2 + 0x4e;
              }
              else {
                iVar62 = (uint)(uVar22 != 0) * 2 + 0x4d;
              }
              disableTerm(pLevel,pWVar36);
            }
            iVar59 = pVVar7->nOp;
            pLevel->op = (uVar22 == 0) * '\x03' | 0x5c;
            pLevel->p1 = iVar23;
            pLevel->p2 = iVar59;
            if (pWVar50 == (WhereTerm *)0x0 && pWVar36 == (WhereTerm *)0x0) {
              pLevel->p5 = '\x01';
            }
            iVar59 = 0;
            if (iVar62 != 0x95) {
              iVar59 = sqlite3GetTempReg(pParse_00);
              sqlite3VdbeAddOp2(pVVar7,0x41,iVar23,iVar59);
              sqlite3ExprCacheStore(pParse_00,iVar23,-1,iVar59);
              sqlite3VdbeAddOp3(pVVar7,iVar62,iVar56,iVar21,iVar59);
              if (pVVar7->aOp != (Op *)0x0) {
                pVVar7->aOp[(long)pVVar7->nOp + -1].p5 = 'k';
              }
            }
            goto LAB_00174186;
          }
          uVar42 = (uVar22 & 0x1000000) >> 0x18;
          uVar64 = (ulong)uVar42;
          if ((uVar39 & 0x30000) != 0) {
            uVar5 = (pLevel->plan).nEq;
            uVar65 = (ulong)uVar5;
            pIVar30 = (pLevel->plan).u.pIdx;
            uVar4 = pIVar30->nColumn;
            iVar21 = -1;
            if (uVar5 != uVar4) {
              iVar21 = pIVar30->aiColumn[uVar65];
            }
            uVar43 = 0;
            bVar66 = true;
            if (((wctrlFlags & 1) != 0) && ((uVar39 & 0x800000) != 0)) {
              bVar66 = uVar4 <= uVar5;
              uVar43 = (uint)(uVar5 < uVar4);
            }
            iVar62 = pLevel->iIdxCur;
            if ((uVar39 >> 0x14 & 1) == 0) {
              local_148 = (WhereTerm *)0x0;
            }
            else {
              local_148 = findTerm(pWVar58,iVar23,iVar21,(Bitmask)local_1c0,0x18,pIVar30);
              uVar39 = (pLevel->plan).wsFlags;
              uVar43 = 1;
            }
            if ((uVar39 >> 0x15 & 1) == 0) {
              local_108 = (WhereTerm *)0x0;
            }
            else {
              local_108 = findTerm(pWVar58,iVar23,iVar21,(Bitmask)local_1c0,0x24,pIVar30);
              uVar43 = 1;
            }
            uVar4 = (pLevel->plan).nEq;
            psVar8 = pParse_00->db;
            pVVar10 = pParse_00->pVdbe;
            iVar21 = pLevel->iTabCur;
            pIVar46 = (pLevel->plan).u.pIdx;
            iVar59 = pParse_00->nMem;
            iVar56 = uVar43 + uVar4;
            pParse_00->nMem = iVar59 + iVar56;
            pcVar40 = sqlite3IndexAffinityStr(pVVar10,pIVar46);
            pcVar40 = sqlite3DbStrDup(psVar8,pcVar40);
            if (pcVar40 == (char *)0x0) {
              pParse_00->db->mallocFailed = '\x01';
            }
            iVar59 = iVar59 + 1;
            uVar44 = 0;
            while ((uVar4 != uVar44 &&
                   (pWVar36 = findTerm(pWVar58,iVar21,pIVar46->aiColumn[uVar44],(Bitmask)local_1c0,
                                       (pLevel->plan).wsFlags,pIVar46), pWVar36 != (WhereTerm *)0x0)
                   )) {
              iVar25 = (int)uVar44;
              iTarget = iVar59 + iVar25;
              iVar24 = codeEqualityTerm(pParse_00,pWVar36,pLevel,iVar25,iTarget);
              if (iTarget != iVar24) {
                if (iVar56 == 1) {
                  sqlite3ReleaseTempReg(pParse_00,iVar59);
                  iVar59 = iVar24;
                }
                else {
                  sqlite3VdbeAddOp2(pVVar10,0xf,iVar24,iTarget);
                }
              }
              if ((pWVar36->eOperator & 0x81) == 0) {
                pEVar27 = pWVar36->pExpr->pRight;
                sqlite3ExprCodeIsNullJump(pVVar10,pEVar27,iVar25 + iVar59,pLevel->addrBrk);
                if (pcVar40 != (char *)0x0) {
                  cVar47 = pcVar40[uVar44];
                  cVar18 = sqlite3CompareAffinity(pEVar27,cVar47);
                  if (cVar18 == 'b') {
                    pcVar40[uVar44] = 'b';
                    cVar47 = 'b';
                  }
                  iVar25 = sqlite3ExprNeedsNoAffinityChange(pEVar27,cVar47);
                  if (iVar25 != 0) {
                    pcVar40[uVar44] = 'b';
                  }
                }
              }
              uVar44 = uVar44 + 1;
            }
            zAff = sqlite3DbStrDup(pParse_00->db,pcVar40);
            iVar21 = pLevel->addrNxt;
            pWVar36 = local_148;
            if (uVar5 < pIVar30->nColumn) {
              if (uVar42 != (pIVar30->aSortOrder[uVar65] == '\0')) {
LAB_00174731:
                pWVar36 = local_108;
                local_108 = local_148;
              }
            }
            else if (pIVar30->nColumn != uVar5 || (uVar22 & 0x1000000) == 0) goto LAB_00174731;
            uVar39 = 1;
            uVar43 = 1;
            if (pWVar36 != (WhereTerm *)0x0) {
              uVar43 = (uint)((pWVar36->eOperator & 0x28) != 0);
            }
            if (local_108 != (WhereTerm *)0x0) {
              uVar39 = (uint)((local_108->eOperator & 0x28) != 0);
            }
            p2 = (uint)uVar5;
            if (pWVar36 == (WhereTerm *)0x0) {
              bVar67 = uVar65 != 0;
              n = (uint)uVar5;
              if (!bVar66) {
                uVar43 = 0;
                sqlite3VdbeAddOp2(pVVar7,10,0,iVar59 + p2);
                goto LAB_00174861;
              }
            }
            else {
              pEVar27 = pWVar36->pExpr->pRight;
              sqlite3ExprCode(pParse_00,pEVar27,iVar59 + p2);
              sqlite3ExprCodeIsNullJump(pVVar7,pEVar27,iVar59 + p2,iVar21);
              if (pcVar40 != (char *)0x0) {
                cVar47 = pcVar40[uVar65];
                cVar18 = sqlite3CompareAffinity(pEVar27,cVar47);
                if (cVar18 == 'b') {
                  pcVar40[uVar65] = 'b';
                  cVar47 = 'b';
                }
                iVar56 = sqlite3ExprNeedsNoAffinityChange(pEVar27,cVar47);
                if (iVar56 != 0) {
                  pcVar40[uVar65] = 'b';
                }
              }
LAB_00174861:
              n = p2 + 1;
              bVar67 = true;
            }
            codeApplyAffinity(pParse_00,iVar59,n,pcVar40);
            sqlite3VdbeAddOp4Int
                      (pVVar7,(uint)*(byte *)((long)&codeOneLoopStart_aStartOp +
                                             (ulong)(uVar43 * 2 + (uint)bVar67 * 4 + uVar42)),iVar62
                       ,iVar21,iVar59,n);
            uVar43 = p2;
            if (local_108 != (WhereTerm *)0x0) {
              pEVar27 = local_108->pExpr->pRight;
              iVar56 = iVar59 + p2;
              sqlite3ExprCacheRemove(pParse_00,iVar56,1);
              sqlite3ExprCode(pParse_00,pEVar27,iVar56);
              sqlite3ExprCodeIsNullJump(pVVar7,pEVar27,iVar56,iVar21);
              if (zAff != (char *)0x0) {
                cVar47 = zAff[uVar65];
                cVar18 = sqlite3CompareAffinity(pEVar27,cVar47);
                if (cVar18 == 'b') {
                  zAff[uVar65] = 'b';
                  cVar47 = 'b';
                }
                iVar56 = sqlite3ExprNeedsNoAffinityChange(pEVar27,cVar47);
                if (iVar56 != 0) {
                  zAff[uVar65] = 'b';
                }
              }
              uVar43 = p2 + 1;
              codeApplyAffinity(pParse_00,iVar59,uVar43,zAff);
            }
            sqlite3DbFree(pParse_00->db,pcVar40);
            sqlite3DbFree(pParse_00->db,zAff);
            pLevel->p2 = pVVar7->nOp;
            if ((uVar65 != 0) || (local_108 != (WhereTerm *)0x0)) {
              sqlite3VdbeAddOp4Int
                        (pVVar7,(uint)*(byte *)((long)&codeOneLoopStart_aEndOp + uVar64 + 1),iVar62,
                         iVar21,iVar59,uVar43);
              if (pVVar7->aOp != (Op *)0x0) {
                pVVar7->aOp[(long)pVVar7->nOp + -1].p5 = uVar39 != uVar42;
              }
            }
            iVar21 = sqlite3GetTempReg(pParse_00);
            if (((pLevel->plan).wsFlags & 0x300000) != 0) {
              sqlite3VdbeAddOp3(pVVar7,0x1d,iVar62,p2,iVar21);
              sqlite3VdbeAddOp2(pVVar7,0x49,iVar21,iVar48);
            }
            sqlite3ReleaseTempReg(pParse_00,iVar21);
            disableTerm(pLevel,pWVar36);
            disableTerm(pLevel,local_108);
            iVar59 = 0;
            if (((wctrlFlags & 0x20) == 0 & (byte)(uVar22 >> 0x16) & 1) == 0) {
              iVar59 = sqlite3GetTempReg(pParse_00);
              sqlite3VdbeAddOp2(pVVar7,99,iVar62,iVar59);
              sqlite3ExprCacheStore(pParse_00,iVar23,-1,iVar59);
              sqlite3VdbeAddOp2(pVVar7,0x32,iVar23,iVar59);
            }
            uVar39 = (pLevel->plan).wsFlags;
            uVar19 = ((uVar22 & 0x1000000) == 0) * '\x03' + '\\';
            if ((uVar39 >> 0x19 & 1) != 0) {
              uVar19 = 0x95;
            }
            pLevel->op = uVar19;
            pLevel->p1 = iVar62;
            if ((int)uVar39 < 0) {
              pLevel->p5 = '\x01';
            }
            goto LAB_00174186;
          }
          if ((uVar39 >> 0x1c & 1) == 0) {
            pLevel->op = *(u8 *)((long)&codeOneLoopStart_aStep + uVar64);
            pLevel->p1 = iVar23;
            iVar21 = sqlite3VdbeAddOp2(pVVar7,(uint)*(byte *)((long)&codeOneLoopStart_aStart +
                                                             uVar64),iVar23,iVar21);
            pLevel->p2 = iVar21 + 1;
            pLevel->p5 = '\x01';
            goto LAB_001740d8;
          }
          iVar21 = pParse_00->nTab;
          pParse_00->nTab = iVar21 + 1;
          iVar62 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar62;
          uVar22 = sqlite3VdbeMakeLabel(pVVar7);
          pIVar30 = (pLevel->plan).u.pIdx;
          ptVar16 = pIVar30->aiRowEst;
          pLevel->op = '\x03';
          pLevel->p1 = iVar62;
          if (pWInfo->nLevel < 2) {
            pTabList_00 = pWInfo->pTabList;
LAB_00174d0e:
            iVar56 = 0;
            iVar25 = 0;
            if ((wctrlFlags & 8) == 0) {
              iVar56 = pParse_00->nMem + 1;
              iVar25 = pParse_00->nMem + 2;
              pParse_00->nMem = iVar25;
              sqlite3VdbeAddOp2(pVVar7,10,0,iVar56);
            }
            uVar39 = sqlite3VdbeAddOp2(pVVar7,7,0,iVar62);
            iVar24 = pWVar58->nTerm;
            local_180 = (ulong)uVar39;
            if (iVar24 < 2) {
              pEVar27 = (Expr *)0x0;
            }
            else {
              lVar26 = 0x1a;
              pEVar27 = (Expr *)0x0;
              for (lVar41 = 0; lVar41 < iVar24; lVar41 = lVar41 + 1) {
                pWVar36 = pWVar58->a;
                pEVar38 = *(Expr **)((long)pWVar36 + lVar26 + -0x1a);
                if ((((pEVar38->flags & 1) == 0) &&
                    ((*(byte *)((long)&pWVar36->pExpr + lVar26) & 0x12) == 0)) &&
                   ((*(ushort *)((long)pWVar36 + lVar26 + -2) & 0xfff) != 0)) {
                  pEVar38 = sqlite3ExprDup(pParse_00->db,pEVar38,0);
                  pEVar27 = sqlite3ExprAnd(pParse_00->db,pEVar27,pEVar38);
                  iVar24 = pWVar58->nTerm;
                }
                lVar26 = lVar26 + 0x38;
              }
              if (pEVar27 == (Expr *)0x0) {
                pEVar27 = (Expr *)0x0;
              }
              else {
                pEVar27 = sqlite3PExpr(pParse_00,0x45,(Expr *)0x0,pEVar27,(Token *)0x0);
              }
            }
            lVar26 = 0;
            local_1a8 = (Index *)0x0;
            bVar66 = false;
            for (uVar64 = 0; (long)uVar64 < (long)(int)ptVar16[7]; uVar64 = uVar64 + 1) {
              lVar41 = *(long *)(ptVar16 + 10);
              if ((*(int *)(lVar41 + 0xc + lVar26) == iVar23) ||
                 ((*(byte *)(lVar41 + 0x19 + lVar26) & 2) != 0)) {
                pEVar38 = *(Expr **)(lVar41 + lVar26);
                if ((pEVar27 != (Expr *)0x0) && ((pEVar38->flags & 1) == 0)) {
                  pEVar27->pLeft = pEVar38;
                  pEVar38 = pEVar27;
                }
                pWInfo_00 = sqlite3WhereBegin(pParse_00,pTabList_00,pEVar38,(ExprList *)0x0,
                                              (ExprList *)0x0,0xf0,iVar21);
                if (pWInfo_00 != (WhereInfo *)0x0) {
                  explainOneScan(pParse_00,pTabList_00,pWInfo_00->a,iVar59,(uint)pLevel->iFrom,0);
                  if ((wctrlFlags & 8) == 0) {
                    uVar65 = uVar64;
                    if (uVar64 == ptVar16[7] - 1) {
                      uVar65 = 0xffffffffffffffff;
                    }
                    iVar24 = sqlite3ExprCodeGetColumn
                                       (pParse_00,pSVar12->a[bVar2].pTab,-1,iVar23,iVar25,'\0');
                    sqlite3VdbeAddOp4Int(pVVar7,0x72,iVar56,pVVar7->nOp + 2,iVar24,(int)uVar65);
                  }
                  sqlite3VdbeAddOp2(pVVar7,2,iVar62,uVar22);
                  if (pWInfo_00->untestedTerms != '\0') {
                    bVar66 = true;
                  }
                  uVar42 = pWInfo_00->a[0].plan.wsFlags;
                  if (((byte)(uVar42 >> 0x1d) & 1) == 0 && (uVar42 & 0xf0000) != 0) {
                    pIVar46 = pWInfo_00->a[0].plan.u.pIdx;
                    if ((uVar64 != 0) && (pIVar46 != local_1a8)) {
                      pIVar46 = (Index *)0x0;
                    }
                  }
                  else {
                    pIVar46 = (Index *)0x0;
                  }
                  sqlite3WhereEnd(pWInfo_00);
                  local_1a8 = pIVar46;
                }
              }
              lVar26 = lVar26 + 0x38;
            }
            (pLevel->u).pCovidx = local_1a8;
            if (local_1a8 != (Index *)0x0) {
              pLevel->iIdxCur = iVar21;
            }
            if (pEVar27 != (Expr *)0x0) {
              pEVar27->pLeft = (Expr *)0x0;
              sqlite3ExprDelete(pParse_00->db,pEVar27);
            }
            if (uVar39 < (uint)pVVar7->nOp) {
              pVVar7->aOp[local_180].p1 = pVVar7->nOp;
            }
            sqlite3VdbeAddOp2(pVVar7,1,0,pLevel->addrBrk);
            if (pVVar7->aLabel != (int *)0x0) {
              pVVar7->aLabel[(int)~uVar22] = pVVar7->nOp;
            }
            if (1 < pWInfo->nLevel) {
              sqlite3DbFree(pParse_00->db,pTabList_00);
            }
            iVar59 = 0;
            if (!bVar66) {
              disableTerm(pLevel,(WhereTerm *)pIVar30);
            }
            goto LAB_00174186;
          }
          iVar56 = pWInfo->nLevel - iVar59;
          pTabList_00 = (SrcList *)sqlite3DbMallocRaw(pParse_00->db,iVar56 * 0x68 + 8);
          if (pTabList_00 != (SrcList *)0x0) {
            pTabList_00->nAlloc = (i16)iVar56;
            pTabList_00->nSrc = (i16)iVar56;
            pSVar51 = pSVar12->a + bVar2;
            pSVar53 = pTabList_00->a;
            for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
              pSVar53->pSchema = pSVar51->pSchema;
              pSVar51 = (SrcList_item *)((long)pSVar51 + ((ulong)bVar68 * -2 + 1) * 8);
              pSVar53 = (SrcList_item *)((long)pSVar53 + (ulong)bVar68 * -0x10 + 8);
            }
            pSVar17 = pWInfo->pTabList;
            pSVar37 = pTabList_00 + 1;
            pbVar55 = pbVar34;
            for (lVar26 = 1; lVar26 < iVar56; lVar26 = lVar26 + 1) {
              pSVar51 = pSVar17->a + *pbVar55;
              pSVar54 = pSVar37;
              for (lVar41 = 0xd; lVar41 != 0; lVar41 = lVar41 + -1) {
                *(Schema **)pSVar54 = pSVar51->pSchema;
                pSVar51 = (SrcList_item *)((long)pSVar51 + (ulong)bVar68 * -0x10 + 8);
                pSVar54 = (SrcList *)((long)pSVar54 + (ulong)bVar68 * -0x10 + 8);
              }
              pSVar37 = (SrcList *)&pSVar37->a[0].pIndex;
              pbVar55 = pbVar55 + 0x60;
            }
            goto LAB_00174d0e;
          }
        }
        else {
          iVar59 = pSVar12->a[bVar2].regReturn;
          sqlite3VdbeAddOp2(pVVar7,7,pSVar12->a[bVar2].addrFillSub + -1,iVar59);
          iVar62 = sqlite3VdbeAddOp1(pVVar7,4,iVar59);
          pLevel->p2 = iVar62;
          sqlite3VdbeAddOp2(pVVar7,0x1b,iVar59 + 1,iVar21);
          pLevel->op = '\x01';
          iVar59 = 0;
LAB_00174186:
          BVar32 = getMask(pWVar58->pMaskSet,iVar23);
          uVar64 = ~BVar32 & (ulong)local_1c0;
          pWVar36 = pWVar58->a;
          for (iVar21 = pWVar58->nTerm; 0 < iVar21; iVar21 = iVar21 + -1) {
            if ((pWVar36->wtFlags & 6) == 0) {
              if ((pWVar36->prereqAll & uVar64) == 0) {
                if ((pLevel->iLeftJoin == 0) || ((pWVar36->pExpr->flags & 1) != 0)) {
                  sqlite3ExprIfFalse(pParse_00,pWVar36->pExpr,iVar48,8);
                  pWVar36->wtFlags = pWVar36->wtFlags | 4;
                }
              }
              else {
                pWInfo->untestedTerms = '\x01';
              }
            }
            pWVar36 = pWVar36 + 1;
          }
          puVar63 = &pWVar58->a->wtFlags;
          for (iVar21 = pWVar58->nTerm; 0 < iVar21; iVar21 = iVar21 + -1) {
            if ((((*puVar63 & 6) == 0) && (*(u16 *)(puVar63 + -2) == 0x402)) &&
               (*(int *)(puVar63 + -0xe) == iVar23)) {
              pEVar27 = ((WhereTerm *)(puVar63 + -0x1a))->pExpr;
              pWVar36 = findTerm(pWVar58,iVar23,
                                 ((anon_union_8_3_737c4e49_for_u *)(puVar63 + -10))->leftColumn,
                                 (Bitmask)local_1c0,3,(Index *)0x0);
              if ((pWVar36 != (WhereTerm *)0x0) && ((pWVar36->wtFlags & 4) == 0)) {
                pEVar38 = pWVar36->pExpr;
                pEVar52 = (Expr *)&rTemp;
                for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
                  cVar47 = pEVar38->affinity;
                  uVar20 = pEVar38->flags;
                  uVar6 = *(undefined4 *)&pEVar38->field_0x4;
                  pEVar52->op = pEVar38->op;
                  pEVar52->affinity = cVar47;
                  pEVar52->flags = uVar20;
                  *(undefined4 *)&pEVar52->field_0x4 = uVar6;
                  pEVar38 = (Expr *)((long)pEVar38 + ((ulong)bVar68 * -2 + 1) * 8);
                  pEVar52 = (Expr *)((long)pEVar52 + (ulong)bVar68 * -0x10 + 8);
                }
                pPStack_68 = (Parse *)pEVar27->pLeft;
                sqlite3ExprIfFalse(pParse_00,(Expr *)&rTemp,iVar48,8);
              }
            }
            puVar63 = puVar63 + 0x38;
          }
          if (pLevel->iLeftJoin != 0) {
            pLevel->addrFirst = pVVar7->nOp;
            sqlite3VdbeAddOp2(pVVar7,7,1,pLevel->iLeftJoin);
            sqlite3ExprCacheClear(pParse_00);
            pWVar36 = pWVar58->a;
            for (iVar23 = 0; iVar23 < pWVar58->nTerm; iVar23 = iVar23 + 1) {
              if (((pWVar36->wtFlags & 6) == 0) && ((pWVar36->prereqAll & uVar64) == 0)) {
                sqlite3ExprIfFalse(pParse_00,pWVar36->pExpr,iVar48,8);
                pWVar36->wtFlags = pWVar36->wtFlags | 4;
              }
              pWVar36 = pWVar36 + 1;
            }
          }
          sqlite3ReleaseTempReg(pParse_00,iVar59);
          local_1c0 = (WhereLevel *)uVar64;
        }
        pWInfo->iContinue = pLevel->addrCont;
        uVar60 = uVar60 + 1;
        pbVar34 = pbVar34 + 0x60;
      } while( true );
    }
  }
  else {
LAB_00173609:
    if (pWInfo == (WhereInfo *)0x0) {
      return (WhereInfo *)0x0;
    }
  }
LAB_00173613:
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(psVar8,pWInfo);
  return (WhereInfo *)0x0;
LAB_0017311d:
  pWInfo->eDistinct = '\x01';
LAB_00173129:
  pDistinct = (ExprList *)0x0;
  goto LAB_00173134;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,        /* The parser context */
  SrcList *pTabList,    /* A list of all tables to be scanned */
  Expr *pWhere,         /* The WHERE clause */
  ExprList *pOrderBy,   /* An ORDER BY clause, or NULL */
  ExprList *pDistinct,  /* The select-list for DISTINCT queries - or NULL */
  u16 wctrlFlags,       /* One of the WHERE_* flags defined in sqliteInt.h */
  int iIdxCur           /* If WHERE_ONETABLE_ONLY is set, index cursor number */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereBestIdx sWBI;         /* Best index search context */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  int iFrom;                 /* First unused FROM clause element */
  int andFlags;              /* AND-ed combination of all pWC->a[].wtFlags */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */


  /* Variable initialization */
  memset(&sWBI, 0, sizeof(sWBI));
  sWBI.pParse = pParse;

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_ONETABLE_ONLY flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_ONETABLE_ONLY) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  db = pParse->db;
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocZero(db, 
      nByteWInfo + 
      sizeof(WhereClause) +
      sizeof(WhereMaskSet)
  );
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->nLevel = nTabList;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->iBreak = sqlite3VdbeMakeLabel(v);
  pWInfo->pWC = sWBI.pWC = (WhereClause *)&((u8 *)pWInfo)[nByteWInfo];
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pMaskSet = (WhereMaskSet*)&sWBI.pWC[1];
  sWBI.aLevel = pWInfo->a;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ) pDistinct = 0;

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  whereClauseInit(sWBI.pWC, pParse, pMaskSet, wctrlFlags);
  sqlite3ExprCodeConstants(pParse, pWhere);
  whereSplit(sWBI.pWC, pWhere, TK_AND);   /* IMP: R-15842-53296 */
    
  /* Special case: a WHERE clause that is constant.  Evaluate the
  ** expression and either jump over all of the code or fall thru.
  */
  if( pWhere && (nTabList==0 || sqlite3ExprIsConstantNotJoin(pWhere)) ){
    sqlite3ExprIfFalse(pParse, pWhere, pWInfo->iBreak, SQLITE_JUMPIFNULL);
    pWhere = 0;
  }

  /* Assign a bit from the bitmask to every term in the FROM clause.
  **
  ** When assigning bitmask values to FROM clause cursors, it must be
  ** the case that if X is the bitmask for the N-th FROM clause term then
  ** the bitmask for all FROM clause terms to the left of the N-th term
  ** is (X-1).   An expression from the ON clause of a LEFT JOIN can use
  ** its Expr.iRightJoinTable value to find the bitmask of the right table
  ** of the join.  Subtracting one from the right table bitmask gives a
  ** bitmask for all tables to the left of the join.  Knowing the bitmask
  ** for all tables to the left of a left join is important.  Ticket #3015.
  **
  ** Note that bitmasks are created for all pTabList->nSrc tables in
  ** pTabList, not just the first nTabList tables.  nTabList is normally
  ** equal to pTabList->nSrc but might be shortened to 1 if the
  ** WHERE_ONETABLE_ONLY flag is set.
  */
  for(ii=0; ii<pTabList->nSrc; ii++){
    createMask(pMaskSet, pTabList->a[ii].iCursor);
  }
#ifndef NDEBUG
  {
    Bitmask toTheLeft = 0;
    for(ii=0; ii<pTabList->nSrc; ii++){
      Bitmask m = getMask(pMaskSet, pTabList->a[ii].iCursor);
      assert( (m-1)==toTheLeft );
      toTheLeft |= m;
    }
  }
#endif

  /* Analyze all of the subexpressions.  Note that exprAnalyze() might
  ** add new virtual terms onto the end of the WHERE clause.  We do not
  ** want to analyze these virtual terms, so start analyzing at the end
  ** and work forward so that the added virtual terms are never processed.
  */
  exprAnalyzeAll(pTabList, sWBI.pWC);
  if( db->mallocFailed ){
    goto whereBeginError;
  }

  /* Check if the DISTINCT qualifier, if there is one, is redundant. 
  ** If it is, then set pDistinct to NULL and WhereInfo.eDistinct to
  ** WHERE_DISTINCT_UNIQUE to tell the caller to ignore the DISTINCT.
  */
  if( pDistinct && isDistinctRedundant(pParse, pTabList, sWBI.pWC, pDistinct) ){
    pDistinct = 0;
    pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
  }

  /* Chose the best index to use for each table in the FROM clause.
  **
  ** This loop fills in the following fields:
  **
  **   pWInfo->a[].pIdx      The index to use for this level of the loop.
  **   pWInfo->a[].wsFlags   WHERE_xxx flags associated with pIdx
  **   pWInfo->a[].nEq       The number of == and IN constraints
  **   pWInfo->a[].iFrom     Which term of the FROM clause is being coded
  **   pWInfo->a[].iTabCur   The VDBE cursor for the database table
  **   pWInfo->a[].iIdxCur   The VDBE cursor for the index
  **   pWInfo->a[].pTerm     When wsFlags==WO_OR, the OR-clause term
  **
  ** This loop also figures out the nesting order of tables in the FROM
  ** clause.
  */
  sWBI.notValid = ~(Bitmask)0;
  sWBI.pOrderBy = pOrderBy;
  sWBI.n = nTabList;
  sWBI.pDistinct = pDistinct;
  andFlags = ~0;
  WHERETRACE(("*** Optimizer Start ***\n"));
  for(sWBI.i=iFrom=0, pLevel=pWInfo->a; sWBI.i<nTabList; sWBI.i++, pLevel++){
    WhereCost bestPlan;         /* Most efficient plan seen so far */
    Index *pIdx;                /* Index for FROM table at pTabItem */
    int j;                      /* For looping over FROM tables */
    int bestJ = -1;             /* The value of j */
    Bitmask m;                  /* Bitmask value for j or bestJ */
    int isOptimal;              /* Iterator for optimal/non-optimal search */
    int ckOptimal;              /* Do the optimal scan check */
    int nUnconstrained;         /* Number tables without INDEXED BY */
    Bitmask notIndexed;         /* Mask of tables that cannot use an index */

    memset(&bestPlan, 0, sizeof(bestPlan));
    bestPlan.rCost = SQLITE_BIG_DBL;
    WHERETRACE(("*** Begin search for loop %d ***\n", sWBI.i));

    /* Loop through the remaining entries in the FROM clause to find the
    ** next nested loop. The loop tests all FROM clause entries
    ** either once or twice. 
    **
    ** The first test is always performed if there are two or more entries
    ** remaining and never performed if there is only one FROM clause entry
    ** to choose from.  The first test looks for an "optimal" scan.  In
    ** this context an optimal scan is one that uses the same strategy
    ** for the given FROM clause entry as would be selected if the entry
    ** were used as the innermost nested loop.  In other words, a table
    ** is chosen such that the cost of running that table cannot be reduced
    ** by waiting for other tables to run first.  This "optimal" test works
    ** by first assuming that the FROM clause is on the inner loop and finding
    ** its query plan, then checking to see if that query plan uses any
    ** other FROM clause terms that are sWBI.notValid.  If no notValid terms
    ** are used then the "optimal" query plan works.
    **
    ** Note that the WhereCost.nRow parameter for an optimal scan might
    ** not be as small as it would be if the table really were the innermost
    ** join.  The nRow value can be reduced by WHERE clause constraints
    ** that do not use indices.  But this nRow reduction only happens if the
    ** table really is the innermost join.  
    **
    ** The second loop iteration is only performed if no optimal scan
    ** strategies were found by the first iteration. This second iteration
    ** is used to search for the lowest cost scan overall.
    **
    ** Without the optimal scan step (the first iteration) a suboptimal
    ** plan might be chosen for queries like this:
    **   
    **   CREATE TABLE t1(a, b); 
    **   CREATE TABLE t2(c, d);
    **   SELECT * FROM t2, t1 WHERE t2.rowid = t1.a;
    **
    ** The best strategy is to iterate through table t1 first. However it
    ** is not possible to determine this with a simple greedy algorithm.
    ** Since the cost of a linear scan through table t2 is the same 
    ** as the cost of a linear scan through table t1, a simple greedy 
    ** algorithm may choose to use t2 for the outer loop, which is a much
    ** costlier approach.
    */
    nUnconstrained = 0;
    notIndexed = 0;

    /* The optimal scan check only occurs if there are two or more tables
    ** available to be reordered */
    if( iFrom==nTabList-1 ){
      ckOptimal = 0;  /* Common case of just one table in the FROM clause */
    }else{
      ckOptimal = -1;
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          if( j==iFrom ) iFrom++;
          continue;
        }
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ) break;
        if( ++ckOptimal ) break;
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( ckOptimal==0 || ckOptimal==1 );

    for(isOptimal=ckOptimal; isOptimal>=0 && bestJ<0; isOptimal--){
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ){
          /* This break and one like it in the ckOptimal computation loop
          ** above prevent table reordering across LEFT and CROSS JOINs.
          ** The LEFT JOIN case is necessary for correctness.  The prohibition
          ** against reordering across a CROSS JOIN is an SQLite feature that
          ** allows the developer to control table reordering */
          break;
        }
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          assert( j>iFrom );
          continue;
        }
        sWBI.notReady = (isOptimal ? m : sWBI.notValid);
        if( sWBI.pSrc->pIndex==0 ) nUnconstrained++;
  
        WHERETRACE(("   === trying table %d (%s) with isOptimal=%d ===\n",
                    j, sWBI.pSrc->pTab->zName, isOptimal));
        assert( sWBI.pSrc->pTab );
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(sWBI.pSrc->pTab) ){
          sWBI.ppIdxInfo = &pWInfo->a[j].pIdxInfo;
          bestVirtualIndex(&sWBI);
        }else 
#endif
        {
          bestBtreeIndex(&sWBI);
        }
        assert( isOptimal || (sWBI.cost.used&sWBI.notValid)==0 );

        /* If an INDEXED BY clause is present, then the plan must use that
        ** index if it uses any index at all */
        assert( sWBI.pSrc->pIndex==0 
                  || (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0
                  || sWBI.cost.plan.u.pIdx==sWBI.pSrc->pIndex );

        if( isOptimal && (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0 ){
          notIndexed |= m;
        }
        if( isOptimal ){
          pWInfo->a[j].rOptCost = sWBI.cost.rCost;
        }else if( ckOptimal ){
          /* If two or more tables have nearly the same outer loop cost, but
          ** very different inner loop (optimal) cost, we want to choose
          ** for the outer loop that table which benefits the least from
          ** being in the inner loop.  The following code scales the 
          ** outer loop cost estimate to accomplish that. */
          WHERETRACE(("   scaling cost from %.1f to %.1f\n",
                      sWBI.cost.rCost,
                      sWBI.cost.rCost/pWInfo->a[j].rOptCost));
          sWBI.cost.rCost /= pWInfo->a[j].rOptCost;
        }

        /* Conditions under which this table becomes the best so far:
        **
        **   (1) The table must not depend on other tables that have not
        **       yet run.  (In other words, it must not depend on tables
        **       in inner loops.)
        **
        **   (2) (This rule was removed on 2012-11-09.  The scaling of the
        **       cost using the optimal scan cost made this rule obsolete.)
        **
        **   (3) All tables have an INDEXED BY clause or this table lacks an
        **       INDEXED BY clause or this table uses the specific
        **       index specified by its INDEXED BY clause.  This rule ensures
        **       that a best-so-far is always selected even if an impossible
        **       combination of INDEXED BY clauses are given.  The error
        **       will be detected and relayed back to the application later.
        **       The NEVER() comes about because rule (2) above prevents
        **       An indexable full-table-scan from reaching rule (3).
        **
        **   (4) The plan cost must be lower than prior plans, where "cost"
        **       is defined by the compareCost() function above. 
        */
        if( (sWBI.cost.used&sWBI.notValid)==0                    /* (1) */
            && (nUnconstrained==0 || sWBI.pSrc->pIndex==0        /* (3) */
                || NEVER((sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)!=0))
            && (bestJ<0 || compareCost(&sWBI.cost, &bestPlan))   /* (4) */
        ){
          WHERETRACE(("   === table %d (%s) is best so far\n"
                      "       cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=%08x\n",
                      j, sWBI.pSrc->pTab->zName,
                      sWBI.cost.rCost, sWBI.cost.plan.nRow,
                      sWBI.cost.plan.nOBSat, sWBI.cost.plan.wsFlags));
          bestPlan = sWBI.cost;
          bestJ = j;
        }

        /* In a join like "w JOIN x LEFT JOIN y JOIN z"  make sure that
        ** table y (and not table z) is always the next inner loop inside
        ** of table x. */
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( bestJ>=0 );
    assert( sWBI.notValid & getMask(pMaskSet, pTabList->a[bestJ].iCursor) );
    assert( bestJ==iFrom || (pTabList->a[iFrom].jointype & JT_LEFT)==0 );
    testcase( bestJ>iFrom && (pTabList->a[iFrom].jointype & JT_CROSS)!=0 );
    testcase( bestJ>iFrom && bestJ<nTabList-1
                          && (pTabList->a[bestJ+1].jointype & JT_LEFT)!=0 );
    WHERETRACE(("*** Optimizer selects table %d (%s) for loop %d with:\n"
                "    cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=0x%08x\n",
                bestJ, pTabList->a[bestJ].pTab->zName,
                pLevel-pWInfo->a, bestPlan.rCost, bestPlan.plan.nRow,
                bestPlan.plan.nOBSat, bestPlan.plan.wsFlags));
    if( (bestPlan.plan.wsFlags & WHERE_DISTINCT)!=0 ){
      assert( pWInfo->eDistinct==0 );
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
    andFlags &= bestPlan.plan.wsFlags;
    pLevel->plan = bestPlan.plan;
    pLevel->iTabCur = pTabList->a[bestJ].iCursor;
    testcase( bestPlan.plan.wsFlags & WHERE_INDEXED );
    testcase( bestPlan.plan.wsFlags & WHERE_TEMP_INDEX );
    if( bestPlan.plan.wsFlags & (WHERE_INDEXED|WHERE_TEMP_INDEX) ){
      if( (wctrlFlags & WHERE_ONETABLE_ONLY) 
       && (bestPlan.plan.wsFlags & WHERE_TEMP_INDEX)==0 
      ){
        pLevel->iIdxCur = iIdxCur;
      }else{
        pLevel->iIdxCur = pParse->nTab++;
      }
    }else{
      pLevel->iIdxCur = -1;
    }
    sWBI.notValid &= ~getMask(pMaskSet, pTabList->a[bestJ].iCursor);
    pLevel->iFrom = (u8)bestJ;
    if( bestPlan.plan.nRow>=(double)1 ){
      pParse->nQueryLoop *= bestPlan.plan.nRow;
    }

    /* Check that if the table scanned by this loop iteration had an
    ** INDEXED BY clause attached to it, that the named index is being
    ** used for the scan. If not, then query compilation has failed.
    ** Return an error.
    */
    pIdx = pTabList->a[bestJ].pIndex;
    if( pIdx ){
      if( (bestPlan.plan.wsFlags & WHERE_INDEXED)==0 ){
        sqlite3ErrorMsg(pParse, "cannot use index: %s", pIdx->zName);
        goto whereBeginError;
      }else{
        /* If an INDEXED BY clause is used, the bestIndex() function is
        ** guaranteed to find the index specified in the INDEXED BY clause
        ** if it find an index at all. */
        assert( bestPlan.plan.u.pIdx==pIdx );
      }
    }
  }
  WHERETRACE(("*** Optimizer Finished ***\n"));
  if( pParse->nErr || db->mallocFailed ){
    goto whereBeginError;
  }
  if( nTabList ){
    pLevel--;
    pWInfo->nOBSat = pLevel->plan.nOBSat;
  }else{
    pWInfo->nOBSat = 0;
  }

  /* If the total query only selects a single row, then the ORDER BY
  ** clause is irrelevant.
  */
  if( (andFlags & WHERE_UNIQUE)!=0 && pOrderBy ){
    assert( nTabList==0 || (pLevel->plan.wsFlags & WHERE_ALL_UNIQUE)!=0 );
    pWInfo->nOBSat = pOrderBy->nExpr;
  }

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  ** The one-pass algorithm only works if the WHERE clause constraints
  ** the statement to update a single row.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 && (andFlags & WHERE_UNIQUE)!=0 ){
    pWInfo->okOnePass = 1;
    pWInfo->a[0].plan.wsFlags &= ~WHERE_IDX_ONLY;
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  sqlite3CodeVerifySchema(pParse, -1); /* Insert the cookie verifier Goto */
  notReady = ~(Bitmask)0;
  pWInfo->nRowOut = (double)1;
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    pWInfo->nRowOut *= pLevel->plan.nRow;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLevel->plan.wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0 ){
      int op = pWInfo->okOnePass ? OP_OpenWrite : OP_OpenRead;
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      testcase( pTab->nCol==BMS-1 );
      testcase( pTab->nCol==BMS );
      if( !pWInfo->okOnePass && pTab->nCol<BMS ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, sqlite3VdbeCurrentAddr(v)-1, 
                            SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->plan.wsFlags & WHERE_TEMP_INDEX)!=0 ){
      constructAutomaticIndex(pParse, sWBI.pWC, pTabItem, notReady, pLevel);
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 ){
      Index *pIx = pLevel->plan.u.pIdx;
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIx);
      int iIndexCur = pLevel->iIdxCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      sqlite3VdbeAddOp4(v, OP_OpenRead, iIndexCur, pIx->tnum, iDb,
                        (char*)pKey, P4_KEYINFO_HANDOFF);
      VdbeComment((v, "%s", pIx->zName));
    }
    sqlite3CodeVerifySchema(pParse, iDb);
    notReady &= ~getMask(sWBI.pWC->pMaskSet, pTabItem->iCursor);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  notReady = ~(Bitmask)0;
  for(ii=0; ii<nTabList; ii++){
    pLevel = &pWInfo->a[ii];
    explainOneScan(pParse, pTabList, pLevel, ii, pLevel->iFrom, wctrlFlags);
    notReady = codeOneLoopStart(pWInfo, ii, wctrlFlags, notReady);
    pWInfo->iContinue = pLevel->addrCont;
  }

#ifdef SQLITE_TEST  /* For testing and debugging use only */
  /* Record in the query plan information about the current table
  ** and the index used to access it (if any).  If the table itself
  ** is not used, its name is just '{}'.  If no index is used
  ** the index is listed as "{}".  If the primary key is used the
  ** index name is '*'.
  */
  for(ii=0; ii<nTabList; ii++){
    char *z;
    int n;
    int w;
    struct SrcList_item *pTabItem;

    pLevel = &pWInfo->a[ii];
    w = pLevel->plan.wsFlags;
    pTabItem = &pTabList->a[pLevel->iFrom];
    z = pTabItem->zAlias;
    if( z==0 ) z = pTabItem->pTab->zName;
    n = sqlite3Strlen30(z);
    if( n+nQPlan < sizeof(sqlite3_query_plan)-10 ){
      if( (w & WHERE_IDX_ONLY)!=0 && (w & WHERE_COVER_SCAN)==0 ){
        memcpy(&sqlite3_query_plan[nQPlan], "{}", 2);
        nQPlan += 2;
      }else{
        memcpy(&sqlite3_query_plan[nQPlan], z, n);
        nQPlan += n;
      }
      sqlite3_query_plan[nQPlan++] = ' ';
    }
    testcase( w & WHERE_ROWID_EQ );
    testcase( w & WHERE_ROWID_RANGE );
    if( w & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      memcpy(&sqlite3_query_plan[nQPlan], "* ", 2);
      nQPlan += 2;
    }else if( (w & WHERE_INDEXED)!=0 && (w & WHERE_COVER_SCAN)==0 ){
      n = sqlite3Strlen30(pLevel->plan.u.pIdx->zName);
      if( n+nQPlan < sizeof(sqlite3_query_plan)-2 ){
        memcpy(&sqlite3_query_plan[nQPlan], pLevel->plan.u.pIdx->zName, n);
        nQPlan += n;
        sqlite3_query_plan[nQPlan++] = ' ';
      }
    }else{
      memcpy(&sqlite3_query_plan[nQPlan], "{} ", 3);
      nQPlan += 3;
    }
  }
  while( nQPlan>0 && sqlite3_query_plan[nQPlan-1]==' ' ){
    sqlite3_query_plan[--nQPlan] = 0;
  }
  sqlite3_query_plan[nQPlan] = 0;
  nQPlan = 0;
#endif /* SQLITE_TEST // Testing and debugging use only */

  /* Record the continuation address in the WhereInfo structure.  Then
  ** clean up and return.
  */
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}